

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_0::TestGroup::init(TestGroup *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  *this_00;
  ContextWrapper *this_01;
  GenFunc *this_02;
  undefined1 *this_03;
  bool *this_04;
  char **ppcVar1;
  TestLog **ppTVar2;
  char **ppcVar3;
  Type **ppTVar4;
  Context *pCVar5;
  ES2Types *pEVar6;
  _Alloc_hider _Var7;
  ulong uVar8;
  int iVar9;
  undefined4 uVar10;
  int extraout_EAX;
  ES2Types *this_05;
  ulong *__dest;
  pointer *__dest_00;
  undefined4 extraout_var;
  TestNode *node;
  TestNode *node_00;
  undefined4 extraout_var_00;
  TestError *this_06;
  long lVar11;
  Context ltCtx;
  size_type __dnew_1;
  size_type __dnew;
  Type *types [4];
  Context local_250;
  ContextWrapper *local_240;
  pointer *local_238;
  pointer local_230;
  pointer local_228 [2];
  ulong *local_218;
  ulong local_210;
  ulong local_208 [2];
  ES2Types *local_1f8;
  undefined8 local_1f0;
  value_type local_1e8;
  FboInputAttacher *local_1c8;
  TextureFboAttacher *local_1c0;
  bool *local_1b8;
  bool *local_1b0;
  undefined1 *local_1a8;
  GenFunc *local_1a0;
  undefined1 *local_198;
  GenFunc *local_190;
  undefined1 *local_188;
  GenFunc *local_180;
  Context *local_178;
  value_type local_170;
  ulong local_150;
  value_type local_148;
  undefined7 *local_128;
  undefined8 local_120;
  undefined7 local_118;
  undefined4 uStack_111;
  undefined1 local_10d;
  ProgramSources local_108;
  
  pCVar5 = (this->super_TestCaseGroup).m_context;
  local_250.m_testCtx = pCVar5->m_testCtx;
  local_250.m_renderCtx = pCVar5->m_renderCtx;
  this_05 = (ES2Types *)operator_new(0xab0);
  deqp::gls::LifetimeTests::details::ES2Types::ES2Types(this_05,&local_250);
  (this_05->super_Types)._vptr_Types = (_func_int **)&PTR_getProgramType_00d1e038;
  local_240 = (ContextWrapper *)local_250.m_renderCtx;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_108._193_8_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_108,0,0xac);
  local_218 = local_208;
  local_150 = 0x73;
  __dest = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_150);
  uVar8 = local_150;
  local_208[0] = local_150;
  local_218 = __dest;
  memcpy(__dest,
         "#version 100\nattribute vec4 pos; uniform float scale; void main () { gl_Position = vec4(scale * pos.xy, pos.zw); }\n"
         ,0x73);
  local_210 = uVar8;
  *(undefined1 *)((long)__dest + uVar8) = 0;
  local_1f0 = (Attacher *)((ulong)local_1f0._4_4_ << 0x20);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1e8,local_218,uVar8 + (long)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources + ((ulong)local_1f0 & 0xffffffff),&local_1e8);
  local_238 = local_228;
  local_170._M_dataplus._M_p = (pointer)0x47;
  __dest_00 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_238,(ulong)&local_170);
  _Var7._M_p = local_170._M_dataplus._M_p;
  local_228[0] = local_170._M_dataplus._M_p;
  local_238 = __dest_00;
  memcpy(__dest_00,"#version 100\nvoid main () { gl_FragColor = vec4(1.0, 0.0, 1.0, 1.0); }\n",0x47)
  ;
  local_230 = _Var7._M_p;
  *((long)__dest_00 + _Var7._M_p) = '\0';
  local_150 = CONCAT44(local_150._4_4_,1);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_238,_Var7._M_p + (long)local_238);
  local_178 = pCVar5;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources + (local_150 & 0xffffffff),&local_148);
  local_108.transformFeedbackBufferMode = 0x8c8c;
  local_118 = 0x69736f505f6c67;
  uStack_111 = 0x6e6f6974;
  local_120 = 0xb;
  local_10d = 0;
  local_170.field_2._M_allocated_capacity._0_7_ = 0x69736f505f6c67;
  local_170.field_2._7_4_ = 0x6e6f6974;
  local_170._M_string_length = 0xb;
  local_170.field_2._M_local_buf[0xb] = '\0';
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_128 = &local_118;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_108.transformFeedbackVaryings,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT17(local_170.field_2._M_local_buf[7],
                             local_170.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT17((undefined1)uStack_111,local_118) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,(ulong)(local_228[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pEVar6 = this_05 + 1;
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)pEVar6,(RenderContext *)local_240,&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_108.attribLocationBindings);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_108.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  *(RenderContext **)&this_05[1].m_bufferBind.m_bindTarget = local_250.m_renderCtx;
  iVar9 = (*(local_250.m_renderCtx)->_vptr_RenderContext[3])();
  if ((char)this_05[1].m_bufferBind.m_bindFunc != '\0') {
    uVar10 = (**(code **)(CONCAT44(extraout_var,iVar9) + 0xb48))
                       (*(undefined4 *)
                         &this_05[1].m_bufferBind.super_Binder.super_ContextWrapper.
                          super_CallLogWrapper.m_gl,"scale");
    *(undefined4 *)&this_05[1].m_bufferBind.m_genRequired = uVar10;
    uVar10 = (**(code **)(CONCAT44(extraout_var,iVar9) + 0x780))
                       (*(undefined4 *)
                         &this_05[1].m_bufferBind.super_Binder.super_ContextWrapper.
                          super_CallLogWrapper.m_gl,"pos");
    *(undefined4 *)&this_05[1].m_bufferBind.field_0x4c = uVar10;
    this_01 = &this_05[1].m_bufferType.super_Type.super_ContextWrapper;
    local_1f8 = pEVar6;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper(this_01,&local_250);
    this_05[1].m_bufferType.super_Type._vptr_Type = (_func_int **)&PTR__Binder_00d1e078;
    this_02 = &this_05[1].m_bufferType.m_genFunc;
    local_240 = this_01;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)this_02,&local_250);
    this_05[1].m_bufferType.m_getName = (char *)&PTR__Type_00d54550;
    *(char **)&this_05[1].m_bufferType.field_0x60 = "query";
    this_05[1].m_bufferType.m_binder = (Binder *)glu::CallLogWrapper::glGenQueries;
    *(undefined8 *)&this_05[1].m_bufferType.m_genCreates = 0;
    this_05[1].m_textureBind.super_Binder._vptr_Binder =
         (_func_int **)glu::CallLogWrapper::glDeleteQueries;
    this_05[1].m_textureBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_gl =
         (Functions *)0x0;
    this_05[1].m_textureBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)glu::CallLogWrapper::glIsQuery;
    *(undefined8 *)
     &this_05[1].m_textureBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog =
         0;
    this_05[1].m_textureBind.super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)&this_05[1].m_bufferType;
    *(undefined1 *)&this_05[1].m_textureBind.super_Binder.super_ContextWrapper.m_ctx.m_testCtx = 0;
    this_03 = &this_05[1].m_textureBind.field_0x38;
    local_180 = this_02;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)this_03,&local_250);
    this_05[1].m_textureBind.m_bindFunc = (BindFunc)&PTR__Binder_00d54500;
    this_05[1].m_textureType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)glu::CallLogWrapper::glBindTransformFeedback;
    *(undefined8 *)
     &this_05[1].m_textureType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = 0;
    this_05[1].m_textureType.super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)0x8e2500008e22;
    *(undefined1 *)&this_05[1].m_textureType.super_Type.super_ContextWrapper.m_ctx.m_testCtx = 1;
    local_190 = &this_05[1].m_textureType.m_genFunc;
    local_188 = this_03;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)local_190,&local_250);
    this_05[1].m_textureType.m_getName = (char *)&PTR__Type_00d54550;
    *(char **)&this_05[1].m_textureType.field_0x60 = "transform_feedback";
    this_05[1].m_textureType.m_binder = (Binder *)glu::CallLogWrapper::glGenTransformFeedbacks;
    *(undefined8 *)&this_05[1].m_textureType.m_genCreates = 0;
    this_05[1].m_rboBind.super_Binder._vptr_Binder =
         (_func_int **)glu::CallLogWrapper::glDeleteTransformFeedbacks;
    this_05[1].m_rboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_gl =
         (Functions *)0x0;
    this_05[1].m_rboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)glu::CallLogWrapper::glIsTransformFeedback;
    *(undefined8 *)
     &this_05[1].m_rboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = 0;
    this_05[1].m_rboBind.super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)&this_05[1].m_textureBind.m_bindFunc;
    *(undefined1 *)&this_05[1].m_rboBind.super_Binder.super_ContextWrapper.m_ctx.m_testCtx = 0;
    local_198 = &this_05[1].m_rboBind.field_0x38;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)local_198,&local_250);
    this_05[1].m_rboType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0
    ;
    *(undefined8 *)
     &this_05[1].m_rboType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = 0;
    this_05[1].m_rboType.super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)0x85b500000000;
    *(undefined1 *)&this_05[1].m_rboType.super_Type.super_ContextWrapper.m_ctx.m_testCtx = 1;
    this_05[1].m_rboBind.m_bindFunc = (BindFunc)&PTR__Binder_00d1e0c8;
    local_1a0 = &this_05[1].m_rboType.m_genFunc;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)local_1a0,&local_250);
    this_05[1].m_rboType.m_getName = (char *)&PTR__Type_00d54550;
    *(char **)&this_05[1].m_rboType.field_0x60 = "vertex_array";
    this_05[1].m_rboType.m_binder = (Binder *)glu::CallLogWrapper::glGenVertexArrays;
    *(undefined8 *)&this_05[1].m_rboType.m_genCreates = 0;
    this_05[1].m_fboBind.super_Binder._vptr_Binder =
         (_func_int **)glu::CallLogWrapper::glDeleteVertexArrays;
    this_05[1].m_fboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_gl =
         (Functions *)0x0;
    this_05[1].m_fboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)glu::CallLogWrapper::glIsVertexArray;
    *(undefined8 *)
     &this_05[1].m_fboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = 0;
    this_05[1].m_fboBind.super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)&this_05[1].m_rboBind.m_bindFunc;
    *(undefined1 *)&this_05[1].m_fboBind.super_Binder.super_ContextWrapper.m_ctx.m_testCtx = 0;
    local_1a8 = &this_05[1].m_fboBind.field_0x38;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)local_1a8,&local_250);
    this_05[1].m_fboBind.m_bindFunc = (BindFunc)&PTR__Binder_00d1e118;
    local_1b0 = &this_05[1].m_fboType.super_Type.super_ContextWrapper.super_CallLogWrapper.
                 m_enableLog;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)local_1b0,&local_250);
    this_05[1].m_fboType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)&PTR__Type_00d54550;
    *(char **)&this_05[1].m_fboType.field_0x40 = "sampler";
    this_05[1].m_fboType.m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glGenSamplers;
    *(undefined8 *)&this_05[1].m_fboType.field_0x50 = 0;
    this_05[1].m_fboType.m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glDeleteSamplers;
    *(undefined8 *)&this_05[1].m_fboType.field_0x60 = 0;
    this_05[1].m_fboType.m_binder = (Binder *)glu::CallLogWrapper::glIsSampler;
    *(undefined8 *)&this_05[1].m_fboType.m_genCreates = 0;
    this_05[1].m_shaderType.super_Type._vptr_Type = (_func_int **)&this_05[1].m_fboBind.m_bindFunc;
    *(undefined1 *)
     &this_05[1].m_shaderType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_gl = 1;
    this_04 = &this_05[1].m_shaderType.super_Type.super_ContextWrapper.super_CallLogWrapper.
               m_enableLog;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)this_04,&local_250);
    ppcVar1 = &this_05[1].m_rboType.m_getName;
    this_05[1].m_programType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)&this_05->m_bufferType;
    *(char ***)
     &this_05[1].m_programType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog =
         ppcVar1;
    this_05[1].m_shaderType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)&PTR_initAttachment_00d1e168;
    this_05[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)pEVar6;
    local_1b8 = this_04;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)&this_05[1].m_texFboAtt,(Context *)&this_05[1].m_programType);
    ppTVar2 = &this_05[1].m_shaderType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log;
    this_05[1].m_texFboAtt.super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.m_testCtx =
         (TestContext *)ppTVar2;
    this_05[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_testCtx =
         (TestContext *)&PTR_drawContainer_00d1e1c8;
    this_05[1].m_texFboAtt.super_FboAttacher.super_Attacher.m_elementType =
         (Type *)this_05[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_renderCtx;
    local_1c8 = &this_05[1].m_texFboInAtt;
    local_1c0 = &this_05[1].m_texFboAtt;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              ((ContextWrapper *)local_1c8,&local_250);
    ppcVar3 = &this_05[1].m_textureType.m_getName;
    this_05[1].m_texFboInAtt.super_InputAttacher.super_ContextWrapper.m_ctx.m_testCtx =
         (TestContext *)&this_05->m_bufferType;
    this_05[1].m_texFboInAtt.super_InputAttacher.m_attacher = (Attacher *)ppcVar3;
    this_05[1].m_texFboAtt.super_FboAttacher.super_Attacher.m_containerType =
         (Type *)&PTR_initAttachment_00d1e1f8;
    deqp::gls::LifetimeTests::details::ContextWrapper::ContextWrapper
              (&this_05[1].m_texFboOutAtt.super_OutputAttacher.super_ContextWrapper,
               (Context *)
               &this_05[1].m_texFboInAtt.super_InputAttacher.super_ContextWrapper.
                super_CallLogWrapper.m_enableLog);
    local_108.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&this_05[1].m_bufferType.m_getName;
    local_108.sources[1].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&this_05[1].m_fboType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log;
    ppTVar4 = &this_05[1].m_texFboAtt.super_FboAttacher.super_Attacher.m_containerType;
    this_05[1].m_texFboOutAtt.super_OutputAttacher.m_attacher = (Attacher *)ppTVar4;
    this_05[1].m_texFboOutAtt.super_OutputAttacher._vptr_OutputAttacher =
         (_func_int **)&PTR_setupContainer_00d1e258;
    this_05[1].m_rboFboAtt.super_FboAttacher.super_Attacher._vptr_Attacher = (_func_int **)local_1f8
    ;
    local_108.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppcVar3;
    local_108.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppcVar1;
    std::
    vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
    ::_M_range_insert<deqp::gls::LifetimeTests::details::Type**>
              ((vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
                *)&(this_05->super_Types).m_types,
               (this_05->super_Types).m_types.
               super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_108);
    this_00 = &(this_05->super_Types).m_attachers;
    local_1f0 = (Attacher *)ppTVar2;
    std::
    vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
              ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
                *)this_00,(Attacher **)&local_1f0);
    local_1f0 = (Attacher *)ppTVar4;
    std::
    vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
              ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
                *)this_00,(Attacher **)&local_1f0);
    local_1f0 = (Attacher *)
                &this_05[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_testCtx;
    std::
    vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
              ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
                *)&(this_05->super_Types).m_inAttachers,(InputAttacher **)&local_1f0);
    local_1f0 = (Attacher *)&this_05[1].m_texFboOutAtt;
    std::
    vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::OutputAttacher*>
              ((vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
                *)&(this_05->super_Types).m_outAttachers,(OutputAttacher **)&local_1f0);
    pCVar5 = local_178;
    pEVar6 = (ES2Types *)
             (this->m_types).
             super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
             .m_data.ptr;
    if (pEVar6 != this_05) {
      if (pEVar6 != (ES2Types *)0x0) {
        (*(pEVar6->super_Types)._vptr_Types[2])();
        (this->m_types).
        super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
        .m_data.ptr = (Types *)0x0;
      }
      (this->m_types).
      super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
      .m_data.ptr = (Types *)this_05;
    }
    deqp::gls::LifetimeTests::details::addTestCases
              ((TestCaseGroup *)this,
               (this->m_types).
               super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
               .m_data.ptr);
    node = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,pCVar5->m_testCtx,"delete_active","Delete active object");
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b770;
    node[1]._vptr_TestNode = (_func_int **)pCVar5;
    tcu::TestNode::addChild((TestNode *)this,node);
    node_00 = (TestNode *)operator_new(0x90);
    tcu::TestCase::TestCase
              ((TestCase *)node_00,pCVar5->m_testCtx,"transform_feedback","Transform Feedback");
    node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b810;
    node_00[1]._vptr_TestNode = (_func_int **)pCVar5;
    iVar9 = (*pCVar5->m_renderCtx->_vptr_RenderContext[3])();
    glu::CallLogWrapper::CallLogWrapper
              ((CallLogWrapper *)&node_00[1].m_testCtx,(Functions *)CONCAT44(extraout_var_00,iVar9),
               pCVar5->m_testCtx->m_log);
    node_00->_vptr_TestNode = (_func_int **)&PTR__TfDeleteActiveTest_00d1e290;
    *(undefined1 *)&node_00[1].m_name._M_string_length = 1;
    tcu::TestNode::addChild(node,node_00);
    return extraout_EAX;
  }
  this_06 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_06,(char *)0x0,"isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
             ,0x5a);
  __cxa_throw(this_06,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TestGroup::init (void)
{
	gles3::Context&	ctx		= getContext();
	lt::Context		ltCtx	(ctx.getRenderContext(), ctx.getTestContext());

	m_types	= MovePtr<Types>(new ES3Types(ltCtx));

	addTestCases(*this, *m_types);

	TestCaseGroup* deleteActiveGroup =
		new TestCaseGroup(ctx, "delete_active", "Delete active object");
	addChild(deleteActiveGroup);
	deleteActiveGroup->addChild(
		new TfDeleteActiveTest(ctx, "transform_feedback", "Transform Feedback"));
}